

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::setEquilibriumPoint(btGeneric6DofSpring2Constraint *this,int index)

{
  btScalar *pbVar1;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  btScalar bVar2;
  
  calculateTransforms((btGeneric6DofSpring2Constraint *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (in_ESI < 3) {
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x5ac));
    bVar2 = pbVar1[in_ESI];
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x374));
    pbVar1[in_ESI] = bVar2;
  }
  else {
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x56c));
    *(btScalar *)(in_RDI + (long)(in_ESI + -3) * 0x58 + 0x424) = pbVar1[in_ESI + -3];
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setEquilibriumPoint(int index)
{
	btAssert((index >= 0) && (index < 6));
	calculateTransforms();
	if (index<3)
		m_linearLimits.m_equilibriumPoint[index] = m_calculatedLinearDiff[index];
	else
		m_angularLimits[index - 3] .m_equilibriumPoint = m_calculatedAxisAngleDiff[index - 3];
}